

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O2

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::_setType
          (ImageTemplate<unsigned_char> *this,uint8_t type,AllocateFunction allocateFunction,
          DeallocateFunction deallocateFunction,CopyFunction copyFunction,SetFunction setFunction)

{
  byte bVar1;
  pointer pp_Var2;
  FunctionFacade *pFVar3;
  
  this->_type = type;
  pFVar3 = FunctionFacade::instance();
  bVar1 = this->_type;
  pp_Var2 = (pFVar3->_allocate).
            super__Vector_base<unsigned_char_*(*)(unsigned_long),_std::allocator<unsigned_char_*(*)(unsigned_long)>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pp_Var2[bVar1] == (_func_uchar_ptr_unsigned_long *)0x0) {
    pp_Var2[bVar1] = (_func_uchar_ptr_unsigned_long *)allocateFunction;
    (pFVar3->_deallocate).
    super__Vector_base<void_(*)(unsigned_char_*),_std::allocator<void_(*)(unsigned_char_*)>_>.
    _M_impl.super__Vector_impl_data._M_start[bVar1] = deallocateFunction;
    (pFVar3->_copy).
    super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long)>_>
    ._M_impl.super__Vector_impl_data._M_start[bVar1] =
         (_func_void_uchar_ptr_uchar_ptr_unsigned_long *)copyFunction;
    (pFVar3->_set).
    super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long)>_>
    ._M_impl.super__Vector_impl_data._M_start[bVar1] =
         (_func_void_uchar_ptr_uchar_unsigned_long *)setFunction;
  }
  return;
}

Assistant:

void _setType( uint8_t type = 0u, AllocateFunction allocateFunction = _allocateMemory, DeallocateFunction deallocateFunction = _deallocateMemory,
                       CopyFunction copyFunction = _copyMemory, SetFunction setFunction = _setMemory )
        {
            _type = type;
            FunctionFacade::instance().initialize( _type, allocateFunction, deallocateFunction, copyFunction, setFunction );
        }